

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EVPathRemote.cpp
# Opt level: O0

void adios2::ReadResponseHandler
               (CManager cm,CMConnection conn,void *vevent,void *client_data,attr_list attrs)

{
  char cVar1;
  element_type *peVar2;
  undefined4 *in_RDX;
  undefined8 in_RDI;
  Params *unaff_retaddr;
  string *in_stack_00000008;
  shared_ptr<adios2::core::Operator> op_1;
  shared_ptr<adios2::core::Operator> op;
  ReadResponseMsg read_response_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_1f0 [4];
  int in_stack_fffffffffffffe14;
  undefined4 in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe1c;
  string *in_stack_fffffffffffffe20;
  string *in_stack_fffffffffffffe28;
  string *in_stack_fffffffffffffe30;
  string local_1b0 [39];
  undefined1 local_189 [40];
  undefined1 local_161 [40];
  allocator local_139;
  string local_138 [32];
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  allocator local_d9;
  string local_d8 [48];
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  allocator local_61;
  string local_60 [48];
  undefined4 *local_30;
  undefined8 local_8;
  
  cVar1 = *(char *)(in_RDX + 4);
  local_30 = in_RDX;
  local_8 = in_RDI;
  if (cVar1 == '\x03') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,"mgard",&local_61);
    local_88 = 0;
    uStack_80 = 0;
    local_98 = 0;
    uStack_90 = 0;
    local_a8 = 0;
    uStack_a0 = 0;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)0xd86bc1);
    core::MakeOperator(in_stack_00000008,unaff_retaddr);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)0xd86bea);
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    peVar2 = std::
             __shared_ptr_access<adios2::core::Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<adios2::core::Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0xd86c11);
    (*peVar2->_vptr_Operator[0x15])
              (peVar2,*(undefined8 *)(local_30 + 8),*(undefined8 *)(local_30 + 6),
               *(undefined8 *)(local_30 + 2));
    std::shared_ptr<adios2::core::Operator>::~shared_ptr
              ((shared_ptr<adios2::core::Operator> *)0xd86c43);
  }
  else if (cVar1 == '\a') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d8,"zfp",&local_d9);
    local_f8 = 0;
    uStack_f0 = 0;
    local_108 = 0;
    uStack_100 = 0;
    local_118 = 0;
    uStack_110 = 0;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)0xd86d1e);
    core::MakeOperator(in_stack_00000008,unaff_retaddr);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)0xd86d47);
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    peVar2 = std::
             __shared_ptr_access<adios2::core::Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<adios2::core::Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0xd86d6e);
    (*peVar2->_vptr_Operator[0x15])
              (peVar2,*(undefined8 *)(local_30 + 8),*(undefined8 *)(local_30 + 6),
               *(undefined8 *)(local_30 + 2));
    std::shared_ptr<adios2::core::Operator>::~shared_ptr
              ((shared_ptr<adios2::core::Operator> *)0xd86da0);
  }
  else if (cVar1 == '\x7f') {
    memcpy(*(void **)(in_RDX + 2),*(void **)(in_RDX + 8),*(size_t *)(in_RDX + 6));
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_138,"Remote",&local_139);
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_161;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_161 + 1),"EVPathRemote",(allocator *)__lhs);
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_189;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_189 + 1),"ReadResponseHandler",(allocator *)__rhs)
    ;
    std::__cxx11::to_string(in_stack_fffffffffffffe1c);
    std::operator+((char *)__lhs,__rhs);
    std::operator+(__lhs,(char *)__rhs);
    helper::Throw<std::invalid_argument>
              (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
               (string *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
               in_stack_fffffffffffffe14);
    std::__cxx11::string::~string(local_1b0);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe30);
    std::__cxx11::string::~string(local_1f0);
    std::__cxx11::string::~string((string *)(local_189 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_189);
    std::__cxx11::string::~string((string *)(local_161 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_161);
    std::__cxx11::string::~string(local_138);
    std::allocator<char>::~allocator((allocator<char> *)&local_139);
  }
  CMCondition_signal(local_8,*local_30);
  return;
}

Assistant:

void ReadResponseHandler(CManager cm, CMConnection conn, void *vevent, void *client_data,
                         attr_list attrs)
{
    EVPathRemoteCommon::ReadResponseMsg read_response_msg =
        static_cast<EVPathRemoteCommon::ReadResponseMsg>(vevent);

    switch (read_response_msg->OperatorType)
    {
    case adios2::core::Operator::OperatorType::COMPRESS_MGARD: {
        auto op = adios2::core::MakeOperator("mgard", {});
        op->InverseOperate(read_response_msg->ReadData, read_response_msg->Size,
                           (char *)read_response_msg->Dest);
        break;
    }

    case adios2::core::Operator::OperatorType::COMPRESS_ZFP: {
        auto op = adios2::core::MakeOperator("zfp", {});
        op->InverseOperate(read_response_msg->ReadData, read_response_msg->Size,
                           (char *)read_response_msg->Dest);
        break;
    }

    case adios2::core::Operator::OperatorType::COMPRESS_NULL:
        memcpy(read_response_msg->Dest, read_response_msg->ReadData, read_response_msg->Size);
        break;
    default:
        helper::Throw<std::invalid_argument>("Remote", "EVPathRemote", "ReadResponseHandler",
                                             "Invalid operator type " +
                                                 std::to_string(read_response_msg->OperatorType) +
                                                 " received in response");
    }
    CMCondition_signal(cm, read_response_msg->ReadResponseCondition);
    return;
}